

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::HavingBinder::QualifyColumnName
          (HavingBinder *this,ColumnRefExpression *colref,ErrorData *error)

{
  bool bVar1;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  in_RAX;
  type expr;
  idx_t iVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  
  local_28._M_head_impl =
       (ParsedExpression *)
       in_RAX.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  ExpressionBinder::QualifyColumnName((ExpressionBinder *)&stack0xffffffffffffffd8,colref,error);
  if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_28._M_head_impl == (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0
    ;
  }
  else {
    expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&stack0xffffffffffffffd8);
    iVar2 = BaseSelectBinder::TryBindGroup((BaseSelectBinder *)colref,expr);
    if ((iVar2 == 0xffffffffffffffff) &&
       (bVar1 = ColumnAliasBinder::QualifyColumnAlias
                          ((ColumnAliasBinder *)
                           &colref[1].super_ParsedExpression.super_BaseExpression.query_location,
                           (ColumnRefExpression *)error), bVar1)) {
      (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)0x0;
      if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_28._M_head_impl ==
          (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )this;
      }
      (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             this;
    }
    (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)local_28._M_head_impl;
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> HavingBinder::QualifyColumnName(ColumnRefExpression &colref, ErrorData &error) {
	auto qualified_colref = ExpressionBinder::QualifyColumnName(colref, error);
	if (!qualified_colref) {
		return nullptr;
	}

	auto group_index = TryBindGroup(*qualified_colref);
	if (group_index != DConstants::INVALID_INDEX) {
		return qualified_colref;
	}
	if (column_alias_binder.QualifyColumnAlias(colref)) {
		return nullptr;
	}
	return qualified_colref;
}